

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStems<long_long>
               (char *label_id,longlong *values,int count,double y_ref,double xscale,double x0,
               int offset,int stride)

{
  undefined1 local_88 [8];
  GetterYRef get_base;
  GetterYs<long_long> get_mark;
  int stride_local;
  int offset_local;
  double x0_local;
  double xscale_local;
  double y_ref_local;
  int count_local;
  longlong *values_local;
  char *label_id_local;
  
  GetterYs<long_long>::GetterYs
            ((GetterYs<long_long> *)&get_base.X0,values,count,xscale,x0,offset,stride);
  GetterYRef::GetterYRef((GetterYRef *)local_88,y_ref,count,xscale,x0);
  PlotStemsEx<ImPlot::GetterYs<long_long>,ImPlot::GetterYRef>
            (label_id,(GetterYs<long_long> *)&get_base.X0,(GetterYRef *)local_88);
  return;
}

Assistant:

void PlotStems(const char* label_id, const T* values, int count, double y_ref, double xscale, double x0, int offset, int stride) {
    GetterYs<T> get_mark(values,count,xscale,x0,offset,stride);
    GetterYRef get_base(y_ref,count,xscale,x0);
    PlotStemsEx(label_id, get_mark, get_base);
}